

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericCommand.cpp
# Opt level: O0

string_view __thiscall
Jupiter::GenericCommandNamespace::getHelp(GenericCommandNamespace *this,string_view parameters)

{
  string_view in_command;
  bool bVar1;
  GenericCommand *pGVar2;
  undefined4 extraout_var;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  char *extraout_RDX;
  string_view sVar3;
  GenericCommand *command;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  input_split;
  GenericCommandNamespace *this_local;
  string_view parameters_local;
  char *local_10;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (GenericCommandNamespace *)parameters._M_len;
  input_split.second._M_str = (char *)this;
  jessilib::
  word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)&command,(jessilib *)&this_local,&GENERIC_COMMAND_WORD_DELIMITER_SV,in_RCX);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&input_split.first._M_str);
  if (bVar1) {
    if ((this->m_should_update_help & 1U) != 0) {
      updateHelp(this);
    }
    join_0x00000010_0x00000000_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)&this->m_help);
  }
  else {
    in_command._M_str = (char *)input_split.first._M_len;
    in_command._M_len = (size_t)command;
    pGVar2 = getCommand(this,in_command);
    if (pGVar2 == (GenericCommand *)0x0) {
      join_0x00000010_0x00000000_ = sv("Error: Command not found",0x18);
    }
    else {
      parameters_local._M_str._0_4_ =
           (**(pGVar2->super_Command)._vptr_Command)
                     (pGVar2,input_split.first._M_str,input_split.second._M_len);
      parameters_local._M_str._4_4_ = extraout_var;
      local_10 = extraout_RDX;
    }
  }
  sVar3._M_len = (size_t)parameters_local._M_str;
  sVar3._M_str = local_10;
  return sVar3;
}

Assistant:

std::string_view Jupiter::GenericCommandNamespace::getHelp(std::string_view parameters) {
	auto input_split = jessilib::word_split_once_view(parameters, GENERIC_COMMAND_WORD_DELIMITER_SV);
	if (input_split.second.empty()) // No parameters; list commands
	{
		if (Jupiter::GenericCommandNamespace::m_should_update_help)
			Jupiter::GenericCommandNamespace::updateHelp();

		return Jupiter::GenericCommandNamespace::m_help;
	}

	GenericCommand *command;

	// Search for command
	command = Jupiter::GenericCommandNamespace::getCommand(input_split.first);
	if (command != nullptr) {
		return command->getHelp(input_split.second);
	}

	// Command not found
	return "Error: Command not found"sv;
}